

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

int FindMinBits_TargetCollisionShare(int nbHashes,double share)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined1 in_ZMM0 [64];
  double nbColls;
  double maxColls;
  int nb;
  int local_14;
  
  dVar3 = in_ZMM0._0_8_;
  local_14 = 2;
  while( true ) {
    if (0x3f < local_14) {
      return local_14;
    }
    auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,1L << ((byte)local_14 & 0x3f));
    dVar1 = auVar2._0_8_ * dVar3;
    dVar4 = EstimateNbCollisions((int)((ulong)dVar3 >> 0x20),SUB84(dVar3,0));
    in_ZMM0 = ZEXT864((ulong)dVar1);
    if (dVar4 < dVar1) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

static int FindMinBits_TargetCollisionShare(int nbHashes, double share)
{
    int nb;
    for (nb=2; nb<64; nb++) {
        double const maxColls = (double)(1ULL << nb) * share;
        double const nbColls = EstimateNbCollisions(nbHashes, nb);
        if (nbColls < maxColls) return nb;
    }
    assert(0);
    return nb;
}